

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

bool __thiscall QListViewPrivate::doItemsLayout(QListViewPrivate *this,int delta)

{
  QAbstractItemModel *pQVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long in_FS_OFFSET;
  QListViewLayoutInfo info;
  undefined1 local_68 [24];
  int iStack_50;
  int iStack_4c;
  uint local_48;
  bool bStack_44;
  undefined3 uStack_43;
  Flow FStack_40;
  uint uStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)local_68,&(this->super_QAbstractItemViewPrivate).root);
  iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,local_68);
  uVar5 = iVar3 - 1;
  iVar4 = this->commonListView->batchStartRow;
  uVar6 = (delta + iVar4) - 1;
  if ((int)uVar5 <= (int)uVar6) {
    uVar6 = uVar5;
  }
  if (iVar4 == 0) {
    QAbstractScrollAreaPrivate::layoutChildren((QAbstractScrollAreaPrivate *)this);
    prepareItemsLayout(this);
  }
  uVar2 = 1;
  if ((0 < iVar3) && (iVar4 <= (int)uVar6)) {
    local_68._0_4_ = (this->layoutBounds).x1.m_i;
    local_68._4_4_ = (this->layoutBounds).y1.m_i;
    local_68._8_4_ = (this->layoutBounds).x2;
    local_68._12_4_ = (this->layoutBounds).y2;
    local_68._16_8_ = this->grid;
    iVar3 = 0;
    if (((int)local_68._16_8_ | local_68._20_4_) < 0) {
      iVar3 = this->space;
    }
    _iStack_50 = CONCAT44(iVar4,iVar3);
    _local_48 = CONCAT35(0xaaaaaa,CONCAT14(this->wrap,uVar6));
    _FStack_40 = CONCAT44(uVar5,this->flow);
    iVar4 = (*this->commonListView->_vptr_QCommonListViewBase[4])
                      (this->commonListView,local_68,(ulong)uVar5);
    uVar2 = (undefined1)iVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QListViewPrivate::doItemsLayout(int delta)
{
    int max = model->rowCount(root) - 1;
    int first = batchStartRow();
    int last = qMin(first + delta - 1, max);

    if (first == 0) {
        layoutChildren(); // make sure the viewport has the right size
        prepareItemsLayout();
    }

    if (max < 0 || last < first) {
        return true; // nothing to do
    }

    QListViewLayoutInfo info;
    info.bounds = layoutBounds;
    info.grid = gridSize();
    info.spacing = (info.grid.isValid() ? 0 : spacing());
    info.first = first;
    info.last = last;
    info.wrap = isWrapping();
    info.flow = flow;
    info.max = max;

    return commonListView->doBatchedItemLayout(info, max);
}